

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

DUMB_IT_SIGRENDERER *
init_sigrenderer(DUMB_IT_SIGDATA *sigdata,int n_channels,int startorder,IT_CALLBACKS *callbacks,
                DUMB_CLICK_REMOVER **cr)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  DUMB_IT_SIGRENDERER *vsigrenderer;
  IT_CHANNEL *pIVar5;
  void *pvVar6;
  long lVar7;
  byte bVar8;
  long lVar9;
  
  if (n_channels == 2) {
    if ((sigdata->n_orders < startorder) ||
       (vsigrenderer = (DUMB_IT_SIGRENDERER *)malloc(0x2e98),
       vsigrenderer == (DUMB_IT_SIGRENDERER *)0x0)) {
      free(callbacks);
      dumb_destroy_click_remover_array(2,cr);
    }
    else {
      vsigrenderer->free_playing = (IT_PLAYING *)0x0;
      vsigrenderer->callbacks = callbacks;
      vsigrenderer->click_remover = cr;
      vsigrenderer->sigdata = sigdata;
      vsigrenderer->n_channels = 2;
      vsigrenderer->resampling_quality = dumb_resampling_quality;
      vsigrenderer->ramp_style = 2;
      vsigrenderer->globalvolume = (uchar)sigdata->global_volume;
      vsigrenderer->tempo = sigdata->tempo;
      pIVar5 = vsigrenderer->channel;
      iVar2 = sigdata->flags;
      lVar7 = 0xbc;
      do {
        bVar8 = sigdata->name[lVar7 + -0x40];
        pIVar5->flags = (uint)(bVar8 >> 7);
        pIVar5->volume = ~(byte)iVar2 & 0x40;
        bVar8 = bVar8 & 0x7f;
        pIVar5->pan = bVar8;
        pIVar5->truepan = (ushort)bVar8 << 8;
        pIVar5->channelvolume = sigdata->name[lVar7];
        pIVar5->instrument = '\0';
        pIVar5->sample = 0;
        pIVar5->note = 0xff;
        pIVar5->SFmacro = '\0';
        pIVar5->filter_cutoff = '\x7f';
        pIVar5->filter_resonance = '\0';
        pIVar5->new_note_action = 0xff;
        pIVar5->xm_retrig = '\0';
        pIVar5->retrig_tick = 0;
        pIVar5->glissando = '\0';
        pIVar5->toneslide = 0;
        pIVar5->ptm_toneslide = '\0';
        pIVar5->ptm_last_toneslide = '\0';
        pIVar5->okt_toneslide = '\0';
        pIVar5->inv_loop_offset = 0;
        pIVar5->tremor_time = '\0';
        pIVar5->vibrato_waveform = '\0';
        pIVar5->tremolo_waveform = '\0';
        pIVar5->panbrello_waveform = '\0';
        pIVar5->midi_state = '\0';
        pIVar5->lastvolslide = '\0';
        pIVar5->lastDKL = '\0';
        pIVar5->lastEF = '\0';
        pIVar5->lastG = '\0';
        pIVar5->lastHspeed = '\0';
        pIVar5->lastHdepth = '\0';
        pIVar5->lastRspeed = '\0';
        pIVar5->lastRdepth = '\0';
        pIVar5->lastYspeed = '\0';
        pIVar5->lastYdepth = '\0';
        pIVar5->lastI = '\0';
        pIVar5->lastJ = '\0';
        pIVar5->lastN = '\0';
        pIVar5->lastO = '\0';
        pIVar5->high_offset = '\0';
        pIVar5->high_offset = '\0';
        pIVar5->lastP = '\0';
        pIVar5->lastQ = '\0';
        pIVar5->lastS = '\0';
        pIVar5->pat_loop_row = '\0';
        pIVar5->pat_loop_count = '\0';
        pIVar5->pat_loop_end_row = '\0';
        pIVar5->lastW = '\0';
        pIVar5->xm_lastE1 = '\0';
        pIVar5->xm_lastE2 = '\0';
        pIVar5->xm_lastEA = '\0';
        pIVar5->xm_lastEB = '\0';
        pIVar5->xm_lastX1 = '\0';
        pIVar5->xm_lastX2 = '\0';
        pIVar5->inv_loop_delay = '\0';
        pIVar5->inv_loop_speed = '\0';
        pIVar5->playing = (IT_PLAYING *)0x0;
        pIVar5->played_patjump = (void *)0x0;
        pIVar5->played_patjump_order = 0xfffe;
        lVar7 = lVar7 + 1;
        pIVar5 = pIVar5 + 1;
      } while (lVar7 != 0xfc);
      if ((sigdata->flags & 0x400) != 0) {
        vsigrenderer->globalvolslide = '\0';
        vsigrenderer->temposlide = '\0';
        lVar7 = 0x20;
        do {
          reset_channel_effects
                    ((IT_CHANNEL *)(vsigrenderer->channel[0].arpeggio_offsets + lVar7 + -0x50));
          lVar7 = lVar7 + 0xa0;
        } while (lVar7 != 0x2820);
      }
      memset(vsigrenderer->playing,0,0x600);
      vsigrenderer->speed = sigdata->speed;
      vsigrenderer->processrow = 0xfffe;
      vsigrenderer->breakrow = 0;
      vsigrenderer->n_rows = 0;
      vsigrenderer->rowcount = 1;
      vsigrenderer->order = startorder;
      uVar3 = startorder;
      if (startorder < 1) {
        uVar3 = (uint)sigdata->restart_position;
      }
      vsigrenderer->restart_position = uVar3;
      vsigrenderer->row = 0;
      vsigrenderer->processorder = startorder + -1;
      vsigrenderer->tick = 1;
      pvVar6 = bit_array_create((long)sigdata->n_orders << 8);
      vsigrenderer->played = pvVar6;
      if (0 < sigdata->n_orders) {
        lVar7 = 0;
        do {
          bVar8 = sigdata->order[lVar7];
          iVar2 = sigdata->n_patterns;
          iVar4 = 0xb;
          if ((iVar2 <= (int)(uint)bVar8) && (iVar4 = 8, bVar8 == 0xfe)) {
            lVar9 = 0;
            do {
              bit_array_set(vsigrenderer->played,lVar9 + (ulong)(uint)((int)lVar7 << 8));
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0x100);
            iVar4 = 0;
          }
          if (iVar4 != 0) {
            if (iVar4 != 8) {
              if (iVar2 <= (int)(uint)bVar8) {
                return (DUMB_IT_SIGRENDERER *)0x0;
              }
              vsigrenderer->time_left = 0;
              vsigrenderer->sub_time_left = 0;
              pvVar6 = bit_array_create((long)sigdata->n_orders << 8);
              vsigrenderer->played = pvVar6;
              vsigrenderer->gvz_time = 0;
              vsigrenderer->gvz_sub_time = 0;
              if ((sigdata->flags & 0x2000) == 0) {
                dumb_it_add_lpc(sigdata);
                pbVar1 = (byte *)((long)&sigdata->flags + 1);
                *pbVar1 = *pbVar1 | 0x20;
                return vsigrenderer;
              }
              return vsigrenderer;
            }
            break;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < sigdata->n_orders);
      }
      _dumb_it_end_sigrenderer(vsigrenderer);
    }
  }
  return (DUMB_IT_SIGRENDERER *)0x0;
}

Assistant:

static DUMB_IT_SIGRENDERER *init_sigrenderer(DUMB_IT_SIGDATA *sigdata, int n_channels, int startorder, IT_CALLBACKS *callbacks, DUMB_CLICK_REMOVER **cr)
{
	DUMB_IT_SIGRENDERER *sigrenderer;
	int i;

	/* [RH] Mono destination mixers are disabled. */
	if (n_channels != 2) {
		return NULL;
	}

	if (startorder > sigdata->n_orders) {
		free(callbacks);
		dumb_destroy_click_remover_array(n_channels, cr);
		return NULL;
	}

	sigrenderer = malloc(sizeof(*sigrenderer));
	if (!sigrenderer) {
		free(callbacks);
		dumb_destroy_click_remover_array(n_channels, cr);
		return NULL;
	}

	sigrenderer->free_playing = NULL;
	sigrenderer->callbacks = callbacks;
	sigrenderer->click_remover = cr;

	sigrenderer->sigdata = sigdata;
	sigrenderer->n_channels = n_channels;
	sigrenderer->resampling_quality = dumb_resampling_quality;
    sigrenderer->ramp_style = DUMB_IT_RAMP_FULL;
	sigrenderer->globalvolume = sigdata->global_volume;
	sigrenderer->tempo = sigdata->tempo;

	for (i = 0; i < DUMB_IT_N_CHANNELS; i++) {
		IT_CHANNEL *channel = &sigrenderer->channel[i];
#if IT_CHANNEL_MUTED != 1
#error this is wrong
#endif
		channel->flags = sigdata->channel_pan[i] >> 7;
		channel->volume = (sigdata->flags & IT_WAS_AN_XM) ? 0 : 64;
		channel->pan = sigdata->channel_pan[i] & 0x7F;
		channel->truepan = channel->pan << IT_ENVELOPE_SHIFT;
		channel->channelvolume = sigdata->channel_volume[i];
		channel->instrument = 0;
		channel->sample = 0;
		channel->note = IT_NOTE_OFF;
		channel->SFmacro = 0;
		channel->filter_cutoff = 127;
		channel->filter_resonance = 0;
		channel->new_note_action = 0xFF;
		channel->xm_retrig = 0;
		channel->retrig_tick = 0;
		channel->tremor_time = 0;
		channel->vibrato_waveform = 0;
		channel->tremolo_waveform = 0;
		channel->panbrello_waveform = 0;
		channel->glissando = 0;
		channel->toneslide = 0;
		channel->ptm_toneslide = 0;
		channel->ptm_last_toneslide = 0;
		channel->okt_toneslide = 0;
		channel->midi_state = 0;
		channel->lastvolslide = 0;
		channel->lastDKL = 0;
		channel->lastEF = 0;
		channel->lastG = 0;
		channel->lastHspeed = 0;
		channel->lastHdepth = 0;
		channel->lastRspeed = 0;
		channel->lastRdepth = 0;
		channel->lastYspeed = 0;
		channel->lastYdepth = 0;
		channel->lastI = 0;
		channel->lastJ = 0;
		channel->lastN = 0;
		channel->lastO = 0;
		channel->high_offset = 0;
		channel->lastP = 0;
		channel->lastQ = 0;
		channel->lastS = 0;
		channel->pat_loop_row = 0;
		channel->pat_loop_count = 0;
		channel->pat_loop_end_row = 0;
		channel->lastW = 0;
		channel->xm_lastE1 = 0;
		channel->xm_lastE2 = 0;
		channel->xm_lastEA = 0;
		channel->xm_lastEB = 0;
		channel->xm_lastX1 = 0;
		channel->xm_lastX2 = 0;
		channel->inv_loop_delay = 0;
		channel->inv_loop_speed = 0;
		channel->inv_loop_offset = 0;
		channel->playing = NULL;
#ifdef BIT_ARRAY_BULLSHIT
		channel->played_patjump = NULL;
		channel->played_patjump_order = 0xFFFE;
#endif
		//channel->output = 0;
	}

	if (sigdata->flags & IT_WAS_A_669)
		reset_effects(sigrenderer);

	for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++)
		sigrenderer->playing[i] = NULL;

	sigrenderer->speed = sigdata->speed;

	sigrenderer->processrow = 0xFFFE;
	sigrenderer->n_rows = 0;
	sigrenderer->breakrow = 0;
	sigrenderer->rowcount = 1;
	sigrenderer->order = startorder;
	/* meh!
	if (startorder > 0) {
		int n;
		for (n = startorder - 1; n >= 0; n--) {
			if (sigdata->order[n] > sigdata->n_patterns) {
				sigrenderer->restart_position = n + 1;
				break;
			}
		}
	}
	*/
	if (startorder > 0) {
		sigrenderer->restart_position = startorder;
	} else {
		sigrenderer->restart_position = sigdata->restart_position;
	}

	sigrenderer->row = 0;
	sigrenderer->processorder = startorder - 1;
	sigrenderer->tick = 1;

#ifdef BIT_ARRAY_BULLSHIT
	sigrenderer->played = bit_array_create(sigdata->n_orders * 256);
#endif

	{
		int order;
		for (order = 0; order < sigdata->n_orders; order++) {
			int n = sigdata->order[order];
			if (n < sigdata->n_patterns) goto found_valid_order;
#ifdef INVALID_ORDERS_END_SONG
			if (n != IT_ORDER_SKIP)
#else
			if (n == IT_ORDER_END)
#endif
				break;

#ifdef BIT_ARRAY_BULLSHIT
			/* Fix for played order detection for songs which have skips at the start of the orders list */
			for (n = 0; n < 256; n++) {
				bit_array_set(sigrenderer->played, order * 256 + n);
			}
#endif
		}
		/* If we get here, there were no valid orders in the song. */
		_dumb_it_end_sigrenderer(sigrenderer);
		return NULL;
	}
	found_valid_order:

	sigrenderer->time_left = 0;
	sigrenderer->sub_time_left = 0;

#ifdef BIT_ARRAY_BULLSHIT
	sigrenderer->played = bit_array_create(sigdata->n_orders * 256);
#endif

	sigrenderer->gvz_time = 0;
	sigrenderer->gvz_sub_time = 0;

	//sigrenderer->max_output = 0;

	if ( !(sigdata->flags & IT_WAS_PROCESSED) ) {
		dumb_it_add_lpc( sigdata );

		sigdata->flags |= IT_WAS_PROCESSED;
	}

	return sigrenderer;
}